

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependencyKeyIDs.h
# Opt level: O0

void __thiscall llbuild::core::DependencyKeyIDs::cleanSingleUseDependencies(DependencyKeyIDs *this)

{
  bool bVar1;
  size_t sVar2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_58;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  const_iterator local_48;
  KeyID *local_40;
  __normal_iterator<llbuild::core::KeyID_*,_std::vector<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>_>
  local_38;
  __normal_iterator<llbuild::core::KeyID_*,_std::vector<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>_>
  local_30;
  const_iterator local_28;
  int local_1c;
  int local_18;
  int index;
  int i;
  bool shouldClean;
  DependencyKeyIDs *this_local;
  
  _i = this;
  sVar2 = size(this);
  index._3_1_ = sVar2 != 0;
  if ((bool)index._3_1_) {
    sVar2 = size(this);
    for (local_18 = (int)sVar2; 0 < local_18; local_18 = local_18 + -1) {
      local_1c = local_18 + -1;
      bVar1 = singleUse(this,local_1c);
      if (bVar1) {
        local_38._M_current =
             (KeyID *)std::vector<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>::
                      begin(&this->keys);
        local_30 = __gnu_cxx::
                   __normal_iterator<llbuild::core::KeyID_*,_std::vector<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>_>
                   ::operator+(&local_38,(long)local_1c);
        __gnu_cxx::
        __normal_iterator<llbuild::core::KeyID_const*,std::vector<llbuild::core::KeyID,std::allocator<llbuild::core::KeyID>>>
        ::__normal_iterator<llbuild::core::KeyID*>
                  ((__normal_iterator<llbuild::core::KeyID_const*,std::vector<llbuild::core::KeyID,std::allocator<llbuild::core::KeyID>>>
                    *)&local_28,&local_30);
        local_40 = (KeyID *)std::vector<llbuild::core::KeyID,_std::allocator<llbuild::core::KeyID>_>
                            ::erase(&this->keys,local_28);
        local_58._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                (&this->flags);
        local_50 = __gnu_cxx::
                   __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator+(&local_58,(long)local_1c);
        __gnu_cxx::
        __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
        ::__normal_iterator<unsigned_char*>
                  ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    *)&local_48,&local_50);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase(&this->flags,local_48);
      }
    }
  }
  return;
}

Assistant:

void cleanSingleUseDependencies() {
    bool shouldClean = size() > 0;
    if (!shouldClean) {
      return;
    }
    
    // Go in reverse order to make
    for (int i = (int)size(); i > 0; i--) {
      int index = i - 1;
      if (singleUse(index) == true) {
        keys.erase(keys.begin() + index);
        flags.erase(flags.begin() + index);
      }
    }
  }